

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::
getNumGeneratedElementsPerPrimitive(FeedbackPrimitiveTypeCase *this)

{
  FeedbackPrimitiveTypeCase *this_local;
  
  if (this->m_geometryOutputType == GEOMETRY_OUTPUT_TRIANGLES) {
    this_local._4_4_ = 3;
  }
  else if (this->m_geometryOutputType == GEOMETRY_OUTPUT_LINES) {
    this_local._4_4_ = 2;
  }
  else if (this->m_geometryOutputType == GEOMETRY_OUTPUT_POINTS) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int FeedbackPrimitiveTypeCase::getNumGeneratedElementsPerPrimitive (void) const
{
	if (m_geometryOutputType == GEOMETRY_OUTPUT_TRIANGLES)
		return 3;
	else if (m_geometryOutputType == GEOMETRY_OUTPUT_LINES)
		return 2;
	else if (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS)
		return 1;
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}